

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplex_interface.cpp
# Opt level: O1

void SoPlex_getRowVectorReal(void *soplex,int i,int *nnonzeros,long *indices,double *coefs)

{
  long lVar1;
  DSVector row;
  DSVectorBase<double> local_58;
  int *local_38;
  
  local_58.super_SVectorBase<double>.m_elem = (Nonzero<double> *)0x0;
  local_58.super_SVectorBase<double>.memsize = 0;
  local_58.super_SVectorBase<double>.memused = 0;
  local_58._vptr_DSVectorBase = (_func_int **)&PTR__DSVectorBase_003b0660;
  local_58.theelem = (Nonzero<double> *)0x0;
  local_38 = nnonzeros;
  ::soplex::spx_alloc<soplex::Nonzero<double>*>(&local_58.theelem,8);
  local_58.super_SVectorBase<double>.m_elem = local_58.theelem;
  local_58.super_SVectorBase<double>.memsize = 8;
  local_58.super_SVectorBase<double>.memused = 0;
  ::soplex::SoPlexBase<double>::getRowVectorReal((SoPlexBase<double> *)soplex,i,&local_58);
  *local_38 = local_58.super_SVectorBase<double>.memused;
  if (0 < (long)local_58.super_SVectorBase<double>.memused) {
    lVar1 = 0;
    do {
      *(undefined8 *)((long)coefs + lVar1) =
           *(undefined8 *)((long)&(local_58.super_SVectorBase<double>.m_elem)->val + lVar1 * 2);
      *(long *)((long)indices + lVar1) =
           (long)*(int *)((long)&(local_58.super_SVectorBase<double>.m_elem)->idx + lVar1 * 2);
      lVar1 = lVar1 + 8;
    } while ((long)local_58.super_SVectorBase<double>.memused * 8 != lVar1);
  }
  local_58._vptr_DSVectorBase = (_func_int **)&PTR__DSVectorBase_003b0660;
  if (local_58.theelem != (Nonzero<double> *)0x0) {
    free(local_58.theelem);
  }
  return;
}

Assistant:

void SoPlex_getRowVectorReal(void* soplex, int i, int* nnonzeros, long* indices, double* coefs)
{
   SoPlex* so = (SoPlex*)(soplex);
   DSVector row;

   so->getRowVectorReal(i, row);

   *nnonzeros = row.size();

   for(int j = 0; j < *nnonzeros; ++j)
   {
      coefs[j] = row.value(j);
      indices[j] = row.index(j);
   }
}